

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::HierarchicalInstanceSyntax::HierarchicalInstanceSyntax
          (HierarchicalInstanceSyntax *this,InstanceNameSyntax *decl,Token openParen,
          SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *connections,Token closeParen)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = openParen._0_8_;
  (this->super_SyntaxNode).kind = HierarchicalInstance;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  this->decl = decl;
  (this->openParen).kind = (short)uVar5;
  (this->openParen).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openParen).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openParen).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openParen).info = openParen.info;
  uVar3 = *(undefined4 *)&(connections->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (connections->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->connections).super_SyntaxListBase.super_SyntaxNode.kind =
       (connections->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->connections).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->connections).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->connections).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (connections->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->connections).super_SyntaxListBase.childCount =
       (connections->super_SyntaxListBase).childCount;
  (this->connections).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006d1058;
  sVar2 = (connections->elements)._M_extent._M_extent_value;
  (this->connections).elements._M_ptr = (connections->elements)._M_ptr;
  (this->connections).elements._M_extent._M_extent_value = sVar2;
  (this->closeParen).kind = closeParen.kind;
  (this->closeParen).field_0x2 = closeParen._2_1_;
  (this->closeParen).numFlags = (NumericTokenFlags)closeParen.numFlags.raw;
  (this->closeParen).rawLen = closeParen.rawLen;
  (this->closeParen).info = closeParen.info;
  if (decl != (InstanceNameSyntax *)0x0) {
    (decl->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  (this->connections).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar6 = (this->connections).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->connections).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar4)->parent = &this->super_SyntaxNode;
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

HierarchicalInstanceSyntax(InstanceNameSyntax* decl, Token openParen, const SeparatedSyntaxList<PortConnectionSyntax>& connections, Token closeParen) :
        SyntaxNode(SyntaxKind::HierarchicalInstance), decl(decl), openParen(openParen), connections(connections), closeParen(closeParen) {
        if (this->decl) this->decl->parent = this;
        this->connections.parent = this;
        for (auto child : this->connections)
            child->parent = this;
    }